

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultMpeg4Gif.h
# Opt level: O2

void __thiscall
TgBot::InlineQueryResultMpeg4Gif::InlineQueryResultMpeg4Gif(InlineQueryResultMpeg4Gif *this)

{
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultMpeg4Gif_002cf5a0;
  (this->mpeg4Url)._M_dataplus._M_p = (pointer)&(this->mpeg4Url).field_2;
  (this->mpeg4Url)._M_string_length = 0;
  (this->mpeg4Url).field_2._M_local_buf[0] = '\0';
  (this->thumbUrl)._M_dataplus._M_p = (pointer)&(this->thumbUrl).field_2;
  (this->thumbUrl)._M_string_length = 0;
  (this->thumbUrl).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  this->mpeg4Width = 0;
  this->mpeg4Height = 0;
  return;
}

Assistant:

InlineQueryResultMpeg4Gif() {
        this->type = TYPE;
        this->mpeg4Width = 0;
        this->mpeg4Height = 0;
    }